

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O3

void anon_unknown.dwarf_2eb133::waves(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  unsigned_short uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  ulong local_78;
  
  if (0 < h) {
    lVar8 = 0;
    local_78 = 0;
    do {
      if (0 < w) {
        dVar2 = (double)(int)local_78;
        uVar7 = 0;
        do {
          lVar9 = pixels->_sizeY;
          dVar3 = (double)(int)uVar7;
          pRVar1 = pixels->_data;
          dVar4 = sin(dVar3 * 0.1 + dVar2 * 0.1);
          dVar5 = sin(dVar3 * -0.1 + dVar2 * 0.2);
          fVar10 = (float)(dVar5 * 0.5 + 0.5 + dVar4 * 0.5 + 0.5);
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            if (half::_eLut[(uint)fVar10 >> 0x17] == 0) {
              uVar6 = half::convert((int)fVar10);
            }
            else {
              uVar6 = half::_eLut[(uint)fVar10 >> 0x17] +
                      (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar10 >> 0x10);
          }
          lVar9 = lVar9 * lVar8;
          *(unsigned_short *)((long)&pRVar1[uVar7].r._h + lVar9) = uVar6;
          *(unsigned_short *)((long)&pRVar1[uVar7].g._h + lVar9) = uVar6;
          *(unsigned_short *)((long)&pRVar1[uVar7].b._h + lVar9) = uVar6;
          dVar3 = sin(dVar3 * 1.1 + dVar2 * 0.5);
          fVar10 = (float)(dVar3 * 0.5 + 0.5);
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            if (half::_eLut[(uint)fVar10 >> 0x17] == 0) {
              uVar6 = half::convert((int)fVar10);
            }
            else {
              uVar6 = half::_eLut[(uint)fVar10 >> 0x17] +
                      (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar10 >> 0x10);
          }
          *(unsigned_short *)((long)&pRVar1[uVar7].a._h + lVar9) = uVar6;
          uVar7 = uVar7 + 1;
        } while ((uint)w != uVar7);
      }
      local_78 = local_78 + 1;
      lVar8 = lVar8 + 8;
    } while (local_78 != (uint)h);
  }
  return;
}

Assistant:

void
waves (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (0.5 + 0.5 * sin (0.1 * x + 0.1 * y)) +
		  (0.5 + 0.5 * sin (-0.1 * x + 0.2 * y));

	    p.g = p.r;
	    p.b = p.r;

	    p.a = (0.5 + 0.5 * sin (1.1 * x + 0.5 * y));
	}
    }
}